

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alone_encoder.c
# Opt level: O0

lzma_ret alone_encoder_init(lzma_next_coder *next,lzma_allocator *allocator,
                           lzma_options_lzma *options)

{
  _Bool _Var1;
  lzma_next_coder *__dest;
  undefined1 local_b8 [8];
  lzma_filter_info filters [2];
  uint32_t local_7c;
  undefined1 local_78 [4];
  uint32_t d;
  undefined8 local_70;
  lzma_next_coder *local_30;
  lzma_alone_coder_conflict *coder;
  lzma_options_lzma *options_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  coder = (lzma_alone_coder_conflict *)options;
  options_local = (lzma_options_lzma *)allocator;
  allocator_local = (lzma_allocator *)next;
  if ((code *)next->init != alone_encoder_init) {
    lzma_next_end(next,allocator);
  }
  allocator_local->opaque = alone_encoder_init;
  local_30 = (lzma_next_coder *)allocator_local->alloc;
  if (local_30 == (lzma_next_coder *)0x0) {
    __dest = (lzma_next_coder *)lzma_alloc(0x68,(lzma_allocator *)options_local);
    if (__dest == (lzma_next_coder *)0x0) {
      return LZMA_MEM_ERROR;
    }
    allocator_local->alloc = (_func_void_ptr_void_ptr_size_t_size_t *)__dest;
    allocator_local[1].alloc = alone_encode;
    allocator_local[1].free = alone_encoder_end;
    local_30 = __dest;
    memset(local_78,0,0x48);
    local_70 = 0xffffffffffffffff;
    memcpy(__dest,local_78,0x48);
  }
  *(undefined4 *)&local_30[1].coder = 0;
  local_30[1].id = 0;
  _Var1 = lzma_lzma_lclppb_encode((lzma_options_lzma *)coder,(uint8_t *)&local_30[1].init);
  if (_Var1) {
    next_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  else if (*(uint *)&(coder->next).coder < 0x1000) {
    next_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  else {
    local_7c = *(int *)&(coder->next).coder - 1;
    local_7c = local_7c >> 2 | local_7c;
    local_7c = local_7c >> 3 | local_7c;
    local_7c = local_7c >> 4 | local_7c;
    local_7c = local_7c >> 8 | local_7c;
    local_7c = local_7c >> 0x10 | local_7c;
    if (local_7c != 0xffffffff) {
      local_7c = local_7c + 1;
    }
    write32ne((uint8_t *)((long)&local_30[1].init + 1),local_7c);
    memset((void *)((long)&local_30[1].init + 5),0xff,8);
    local_b8 = (undefined1  [8])0x0;
    filters[0].id = (lzma_vli)lzma_lzma_encoder_init;
    filters[0].init = (lzma_init_function)coder;
    memset(&filters[0].options,0,0x18);
    next_local._4_4_ =
         lzma_next_filter_init
                   (local_30,(lzma_allocator *)options_local,(lzma_filter_info *)local_b8);
  }
  return next_local._4_4_;
}

Assistant:

static lzma_ret
alone_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_options_lzma *options)
{
	lzma_next_coder_init(&alone_encoder_init, next, allocator);

	lzma_alone_coder *coder = next->coder;

	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_alone_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &alone_encode;
		next->end = &alone_encoder_end;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	coder->sequence = SEQ_HEADER;
	coder->header_pos = 0;

	// Encode the header:
	// - Properties (1 byte)
	if (lzma_lzma_lclppb_encode(options, coder->header))
		return LZMA_OPTIONS_ERROR;

	// - Dictionary size (4 bytes)
	if (options->dict_size < LZMA_DICT_SIZE_MIN)
		return LZMA_OPTIONS_ERROR;

	// Round up to the next 2^n or 2^n + 2^(n - 1) depending on which
	// one is the next unless it is UINT32_MAX. While the header would
	// allow any 32-bit integer, we do this to keep the decoder of liblzma
	// accepting the resulting files.
	uint32_t d = options->dict_size - 1;
	d |= d >> 2;
	d |= d >> 3;
	d |= d >> 4;
	d |= d >> 8;
	d |= d >> 16;
	if (d != UINT32_MAX)
		++d;

	write32le(coder->header + 1, d);

	// - Uncompressed size (always unknown and using EOPM)
	memset(coder->header + 1 + 4, 0xFF, 8);

	// Initialize the LZMA encoder.
	const lzma_filter_info filters[2] = {
		{
			.init = &lzma_lzma_encoder_init,
			.options = (void *)(options),
		}, {
			.init = NULL,
		}
	};

	return lzma_next_filter_init(&coder->next, allocator, filters);
}